

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O3

void __thiscall
btCollisionWorld::addCollisionObject
          (btCollisionWorld *this,btCollisionObject *collisionObject,short collisionFilterGroup,
          short collisionFilterMask)

{
  btCollisionObject **ptr;
  uint uVar1;
  int iVar2;
  btCollisionObject **ppbVar3;
  undefined4 extraout_var;
  ulong uVar4;
  btVector3 maxAabb;
  btVector3 minAabb;
  btTransform trans;
  
  uVar1 = (this->m_collisionObjects).m_size;
  if (uVar1 == (this->m_collisionObjects).m_capacity) {
    iVar2 = 1;
    if (uVar1 != 0) {
      iVar2 = uVar1 * 2;
    }
    if ((int)uVar1 < iVar2) {
      if (iVar2 == 0) {
        ppbVar3 = (btCollisionObject **)0x0;
      }
      else {
        ppbVar3 = (btCollisionObject **)btAlignedAllocInternal((long)iVar2 << 3,0x10);
        uVar1 = (this->m_collisionObjects).m_size;
      }
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          ppbVar3[uVar4] = (this->m_collisionObjects).m_data[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      ptr = (this->m_collisionObjects).m_data;
      if ((ptr != (btCollisionObject **)0x0) && ((this->m_collisionObjects).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
        uVar1 = (this->m_collisionObjects).m_size;
      }
      (this->m_collisionObjects).m_ownsMemory = true;
      (this->m_collisionObjects).m_data = ppbVar3;
      (this->m_collisionObjects).m_capacity = iVar2;
    }
  }
  (this->m_collisionObjects).m_data[(int)uVar1] = collisionObject;
  (this->m_collisionObjects).m_size = uVar1 + 1;
  trans.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(collisionObject->m_worldTransform).m_basis.m_el[0].m_floats;
  trans.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((collisionObject->m_worldTransform).m_basis.m_el[0].m_floats + 2);
  trans.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(collisionObject->m_worldTransform).m_basis.m_el[1].m_floats;
  trans.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((collisionObject->m_worldTransform).m_basis.m_el[1].m_floats + 2);
  trans.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(collisionObject->m_worldTransform).m_basis.m_el[2].m_floats;
  trans.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((collisionObject->m_worldTransform).m_basis.m_el[2].m_floats + 2);
  trans.m_origin.m_floats[0] = (collisionObject->m_worldTransform).m_origin.m_floats[0];
  trans.m_origin.m_floats[1] = (collisionObject->m_worldTransform).m_origin.m_floats[1];
  trans.m_origin.m_floats[2] = (collisionObject->m_worldTransform).m_origin.m_floats[2];
  trans.m_origin.m_floats[3] = (collisionObject->m_worldTransform).m_origin.m_floats[3];
  (*collisionObject->m_collisionShape->_vptr_btCollisionShape[2])
            (collisionObject->m_collisionShape,&trans,&minAabb,&maxAabb);
  iVar2 = (*this->m_broadphasePairCache->_vptr_btBroadphaseInterface[2])
                    (this->m_broadphasePairCache,&minAabb,&maxAabb,
                     (ulong)(uint)collisionObject->m_collisionShape->m_shapeType,collisionObject,
                     (ulong)(uint)(int)collisionFilterGroup,(ulong)(uint)(int)collisionFilterMask,
                     this->m_dispatcher1,0);
  collisionObject->m_broadphaseHandle = (btBroadphaseProxy *)CONCAT44(extraout_var,iVar2);
  return;
}

Assistant:

void	btCollisionWorld::addCollisionObject(btCollisionObject* collisionObject,short int collisionFilterGroup,short int collisionFilterMask)
{

	btAssert(collisionObject);

	//check that the object isn't already added
	btAssert( m_collisionObjects.findLinearSearch(collisionObject)  == m_collisionObjects.size());

	m_collisionObjects.push_back(collisionObject);

	//calculate new AABB
	btTransform trans = collisionObject->getWorldTransform();

	btVector3	minAabb;
	btVector3	maxAabb;
	collisionObject->getCollisionShape()->getAabb(trans,minAabb,maxAabb);

	int type = collisionObject->getCollisionShape()->getShapeType();
	collisionObject->setBroadphaseHandle( getBroadphase()->createProxy(
		minAabb,
		maxAabb,
		type,
		collisionObject,
		collisionFilterGroup,
		collisionFilterMask,
		m_dispatcher1,0
		))	;





}